

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O1

int __thiscall amrex::MLMG::bottomSolveWithCG(MLMG *this,Any *x,Any *b,Type type)

{
  iterator __position;
  int iVar1;
  MLCGSolver local_1e0;
  Print local_1b0;
  
  MLCGSolver::MLCGSolver(&local_1e0,this,this->linop,BiCGStab);
  local_1e0.verbose = this->bottom_verbose;
  local_1e0.maxiter = this->bottom_maxiter;
  local_1e0.solver_type = type;
  if (this->cf_strategy == ghostnodes) {
    local_1e0.nghost = (*this->linop->_vptr_MLLinOp[6])(this->linop,0,0);
  }
  iVar1 = MLCGSolver::solve(&local_1e0,x,b,this->bottom_reltol,this->bottom_abstol);
  if ((iVar1 != 0) && (1 < this->verbose)) {
    local_1b0.os = OutStream();
    local_1b0.rank = *(int *)(DAT_00842950 + -0x30);
    local_1b0.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.ss);
    *(undefined8 *)(&local_1b0.field_0x18 + *(long *)(local_1b0._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b0.os + *(long *)(*(long *)local_1b0.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.ss,"MLMG: Bottom solve failed.\n",0x1b);
    Print::~Print(&local_1b0);
  }
  local_1b0.rank = local_1e0.iter;
  __position._M_current =
       (this->m_niters_cg).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_niters_cg).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&(this->m_niters_cg).super_vector<int,_std::allocator<int>_>,__position,
               &local_1b0.rank);
  }
  else {
    *__position._M_current = local_1e0.iter;
    (this->m_niters_cg).super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         __position._M_current + 1;
  }
  MLCGSolver::~MLCGSolver(&local_1e0);
  return iVar1;
}

Assistant:

int
MLMG::bottomSolveWithCG (Any& x, const Any& b, MLCGSolver::Type type)
{
    MLCGSolver cg_solver(this, linop);
    cg_solver.setSolver(type);
    cg_solver.setVerbose(bottom_verbose);
    cg_solver.setMaxIter(bottom_maxiter);
    if (cf_strategy == CFStrategy::ghostnodes) cg_solver.setNGhost(linop.getNGrow());

    int ret = cg_solver.solve(x, b, bottom_reltol, bottom_abstol);
    if (ret != 0 && verbose > 1) {
        amrex::Print() << "MLMG: Bottom solve failed.\n";
    }
    m_niters_cg.push_back(cg_solver.getNumIters());
    return ret;
}